

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void GetBestPredictorForTile
               (uint32_t *all_argb,int subsampling_index,int tile_x,int tile_y,int tiles_per_row,
               uint32_t *all_accumulated_argb,uint32_t **all_modes,uint32_t *all_pred_histos)

{
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  int in_R8D;
  uint32_t *in_R9;
  int64_t cur_diff;
  uint32_t *histo_argb;
  uint32_t *best_histo;
  uint32_t best_mode;
  int64_t best_diff;
  int mode;
  int above_mode;
  int left_mode;
  uint32_t *pred_histos;
  uint32_t *modes;
  uint32_t *accumulated_argb;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar6;
  uint32_t *accumulated;
  uint local_44;
  
  puVar2 = GetAccumulatedHisto(in_R9,in_ESI);
  lVar1 = *(long *)(cur_diff + (long)in_ESI * 8);
  accumulated = (uint32_t *)0x7fffffffffffffff;
  uVar6 = 0;
  puVar3 = GetHistoArgbConst(in_RDI,0,0);
  for (local_44 = 0; (int)local_44 < 0xe; local_44 = local_44 + 1) {
    puVar4 = GetHistoArgbConst(in_RDI,in_ESI,local_44);
    puVar5 = (uint32_t *)
             PredictionCostSpatialHistogram
                       (accumulated,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffa8),
                        (int)((ulong)puVar3 >> 0x20),(int)puVar3,(int)((ulong)puVar4 >> 0x20));
    if ((long)puVar5 < (long)accumulated) {
      puVar3 = puVar4;
      uVar6 = local_44;
      accumulated = puVar5;
    }
  }
  (*VP8LAddVectorEq)(puVar3,puVar2,0x400);
  *(uint *)(lVar1 + (long)(in_ECX * in_R8D + in_EDX) * 4) = uVar6 << 8 | 0xff000000;
  histo_argb[(long)(in_ESI * 0xe) + (ulong)uVar6] =
       histo_argb[(long)(in_ESI * 0xe) + (ulong)uVar6] + 1;
  return;
}

Assistant:

static void GetBestPredictorForTile(const uint32_t* const all_argb,
                                    int subsampling_index, int tile_x,
                                    int tile_y, int tiles_per_row,
                                    uint32_t* all_accumulated_argb,
                                    uint32_t** const all_modes,
                                    uint32_t* const all_pred_histos) {
  uint32_t* const accumulated_argb =
      GetAccumulatedHisto(all_accumulated_argb, subsampling_index);
  uint32_t* const modes = all_modes[subsampling_index];
  uint32_t* const pred_histos =
      &all_pred_histos[subsampling_index * kNumPredModes];
  // Prediction modes of the left and above neighbor tiles.
  const int left_mode =
      (tile_x > 0) ? (modes[tile_y * tiles_per_row + tile_x - 1] >> 8) & 0xff
                   : 0xff;
  const int above_mode =
      (tile_y > 0) ? (modes[(tile_y - 1) * tiles_per_row + tile_x] >> 8) & 0xff
                   : 0xff;
  int mode;
  int64_t best_diff = WEBP_INT64_MAX;
  uint32_t best_mode = 0;
  const uint32_t* best_histo =
      GetHistoArgbConst(all_argb, /*subsampling_index=*/0, best_mode);
  for (mode = 0; mode < kNumPredModes; ++mode) {
    const uint32_t* const histo_argb =
        GetHistoArgbConst(all_argb, subsampling_index, mode);
    const int64_t cur_diff = PredictionCostSpatialHistogram(
        accumulated_argb, histo_argb, mode, left_mode, above_mode);

    if (cur_diff < best_diff) {
      best_histo = histo_argb;
      best_diff = cur_diff;
      best_mode = mode;
    }
  }
  // Update the accumulated histogram.
  VP8LAddVectorEq(best_histo, accumulated_argb, HISTO_SIZE);
  modes[tile_y * tiles_per_row + tile_x] = ARGB_BLACK | (best_mode << 8);
  ++pred_histos[best_mode];
}